

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

int32 arg_strlen(arg_t *defn,int32 *namelen,int32 *deflen)

{
  size_t sVar1;
  int local_28;
  int local_24;
  int32 l;
  int32 i;
  int32 *deflen_local;
  int32 *namelen_local;
  arg_t *defn_local;
  
  *deflen = 0;
  *namelen = 0;
  local_24 = 0;
  while (defn[local_24].name != (char *)0x0) {
    sVar1 = strlen(defn[local_24].name);
    if (*namelen < (int)sVar1) {
      *namelen = (int)sVar1;
    }
    if (defn[local_24].deflt == (char *)0x0) {
      local_28 = 6;
    }
    else {
      sVar1 = strlen(defn[local_24].deflt);
      local_28 = (int)sVar1;
    }
    if (*deflen < local_28) {
      *deflen = local_28;
    }
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

static int32
arg_strlen(const arg_t * defn, int32 * namelen, int32 * deflen)
{
    int32 i, l;

    *namelen = *deflen = 0;
    for (i = 0; defn[i].name; i++) {
        l = strlen(defn[i].name);
        if (*namelen < l)
            *namelen = l;

        if (defn[i].deflt)
            l = strlen(defn[i].deflt);
        else
            l = strlen("(null)");
        /*      E_INFO("string default, %s , name %s, length %d\n",defn[i].deflt,defn[i].name,l); */
        if (*deflen < l)
            *deflen = l;
    }

    return i;
}